

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>::on_oct
          (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>
           *this)

{
  uint uVar1;
  int iVar2;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar3;
  basic_format_specs<char> *in_RDI;
  int unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_00000018;
  anon_class_16_2_cb75083a_for_f in_stack_00000030;
  int num_digits;
  basic_format_specs<char> *specs;
  
  uVar1._0_1_ = in_RDI[1].type;
  uVar1._1_1_ = in_RDI[1].field_0x9;
  uVar1._2_1_ = in_RDI[1].fill.data_[0];
  uVar1._3_1_ = in_RDI[1].fill.data_[1];
  specs = in_RDI;
  iVar2 = count_digits<3u,unsigned_int>(uVar1);
  if (((*(char *)(*(long *)(in_RDI + 1) + 9) < '\0') &&
      (*(int *)(*(long *)(in_RDI + 1) + 4) <= iVar2)) &&
     (iVar2._0_1_ = in_RDI[1].type, iVar2._1_1_ = in_RDI[1].field_0x9,
     iVar2._2_1_ = in_RDI[1].fill.data_[0], iVar2._3_1_ = in_RDI[1].fill.data_[1], iVar2 != 0)) {
    uVar1 = in_RDI[2].width;
    in_RDI[2].width = uVar1 + 1;
    in_RDI[1].fill.data_[(ulong)uVar1 + 2] = '0';
  }
  get_prefix((int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>
              *)0x1777c2);
  bVar3 = write_int<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned_int>::on_oct()::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_>
                    (in_stack_00000018,unaff_retaddr,(string_view)in_stack_00000008,specs,
                     in_stack_00000030);
  *(buffer<char> **)in_RDI = bVar3.container;
  return;
}

Assistant:

void on_oct() {
    int num_digits = count_digits<3>(abs_value);
    if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
      // Octal prefix '0' is counted as a digit, so only add it if precision
      // is not greater than the number of digits.
      prefix[prefix_size++] = '0';
    }
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<3, Char>(it, abs_value, num_digits);
                    });
  }